

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

void proc_pool_join(ProcPool *pool)

{
  int32_t iVar1;
  int iVar2;
  Process *proc;
  int32_t idx;
  long lVar3;
  
  do {
    iVar1 = pool_sync2(pool);
  } while (-1 < iVar1);
  proc = pool->procs;
  lVar3 = 0;
  while( true ) {
    iVar2 = pool->max_num_procs;
    if (0xf < iVar2) {
      iVar2 = 0x10;
    }
    if (iVar2 <= lVar3) break;
    if (proc->valid == true) {
      proc_destroy(proc);
    }
    lVar3 = lVar3 + 1;
    proc = proc + 1;
  }
  return;
}

Assistant:

void proc_pool_join(ProcPool *pool) {
    while ((pool_sync2(pool) >= 0)) {
    }

    // NOTE: Technically this loop is not necessary since `pool_sync` will take
    //       care of destroying terminated process. But we live it here for
    //       the sake of clarity
    for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
         idx++) {
        if (pool->procs[idx].valid) {
            proc_destroy(&pool->procs[idx]);
        }
    }
}